

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall google::protobuf::FieldDescriptor::has_optional_keyword(FieldDescriptor *this)

{
  byte bVar1;
  bool bVar2;
  
  bVar1 = this->field_0x1;
  bVar2 = true;
  if ((bVar1 & 2) == 0) {
    if ((this->file_->edition_ == EDITION_PROTO2) &&
       ((this->merged_features_->field_0)._impl_.field_presence_ != 3)) {
      if (0xbf < bVar1 != (bool)((bVar1 & 0x20) >> 5)) {
        has_optional_keyword();
      }
      if ((bVar1 & 0x20) == 0) {
        bVar2 = (bVar1 & 0x10) == 0;
        if (bVar2) {
          return bVar2;
        }
        if ((this->scope_).containing_oneof != (OneofDescriptor *)0x0) {
          return bVar2;
        }
        internal::protobuf_assumption_failed
                  ("res != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xb31);
      }
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool FieldDescriptor::has_optional_keyword() const {
  return proto3_optional_ ||
         (file()->edition() == Edition::EDITION_PROTO2 && !is_required() &&
          !is_repeated() && !containing_oneof());
}